

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *this_00;
  anon_union_48_1_493b367e_for_ServiceDescriptorProto_3 aVar1;
  void **ppvVar2;
  const_iterator cVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar5 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.method_;
  ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar3 = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::end(this_00);
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::MethodDescriptorProto>
                      ((MethodDescriptorProto *)*ppvVar2);
    sVar5 = sVar5 + sVar4;
  }
  aVar1 = this->field_0;
  if (((undefined1  [48])aVar1 & (undefined1  [48])0x3) != (undefined1  [48])0x0) {
    if (((undefined1  [48])aVar1 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
      sVar4 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        );
      sVar5 = sVar5 + sVar4 + 1;
    }
    if (((undefined1  [48])aVar1 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceOptions>
                        ((this->field_0)._impl_.options_);
      sVar5 = sVar5 + sVar4 + 1;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t ServiceDescriptorProto::ByteSizeLong() const {
  const ServiceDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.MethodDescriptorProto method = 2;
    {
      total_size += 1UL * this_._internal_method_size();
      for (const auto& msg : this_._internal_method()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.ServiceOptions options = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}